

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O2

void __thiscall ShrinkCmd::redo(ShrinkCmd *this)

{
  PatternSelection *this_00;
  Track *this_01;
  TrackRow *pTVar1;
  TrackRow *pTVar2;
  int ch;
  long lVar3;
  size_t row;
  size_t sVar4;
  long lVar5;
  Iterator iter;
  Editor ctx;
  
  Module::edit((Module *)&ctx);
  this_00 = PatternClip::selection(&(this->super_SelectionCmd).mClip);
  PatternSelection::iterator(&iter,this_00);
  for (ch = iter.mStart.super_PatternCursorBase.track; ch <= iter.mEnd.super_PatternCursorBase.track
      ; ch = ch + 1) {
    this_01 = PatternModel::getTrack
                        ((this->super_SelectionCmd).mModel,(uint)(this->super_SelectionCmd).mPattern
                         ,ch);
    row = (size_t)iter.mStart.super_PatternCursorBase.row;
    lVar3 = (long)iter.mEnd.super_PatternCursorBase.row;
    lVar5 = row << 0x20;
    sVar4 = row;
    while( true ) {
      sVar4 = sVar4 + 2;
      lVar5 = lVar5 + 0x100000000;
      row = row + 1;
      if (lVar3 < (long)sVar4) break;
      pTVar1 = trackerboy::Track::operator[](this_01,sVar4);
      pTVar2 = trackerboy::Track::operator[](this_01,row);
      *pTVar2 = *pTVar1;
    }
    for (sVar4 = lVar5 >> 0x20; (long)sVar4 <= lVar3; sVar4 = sVar4 + 1) {
      pTVar1 = trackerboy::Track::operator[](this_01,sVar4);
      pTVar1->note = '\0';
      pTVar1->instrumentId = '\0';
      pTVar1->effects = (_Type)0x0;
    }
  }
  QMutexLocker<QMutex>::unlock(&ctx.super_QMutexLocker<QMutex>);
  PatternModel::invalidate
            ((this->super_SelectionCmd).mModel,(uint)(this->super_SelectionCmd).mPattern,true);
  return;
}

Assistant:

void ShrinkCmd::redo() {
    {
        auto ctx = mModel.mModule.edit();
        auto const iter = mClip.selection().iterator();
        for (auto track = iter.trackStart(); track <= iter.trackEnd(); ++track) {
            TU::shrink(mModel.getTrack(mPattern, track), iter.rowStart(), iter.rowEnd());
        }
    }
    mModel.invalidate(mPattern, true);
}